

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real __thiscall
amrex::MultiFab::norm0(MultiFab *this,iMultiFab *mask,int comp,int nghost,bool local)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  undefined4 in_EDX;
  MFIter *in_RDI;
  byte in_R8B;
  FabArray<amrex::FArrayBox> *extraout_XMM0_Qa;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *mskfab;
  Array4<const_double> *a;
  Box *bx;
  MFIter mfi;
  Real nm0;
  MPI_Comm in_stack_fffffffffffffd3c;
  MFIter *in_stack_fffffffffffffd40;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd60;
  FabArrayBase *in_stack_fffffffffffffd68;
  long *plVar7;
  double local_278;
  int local_26c;
  int local_268;
  int local_264;
  undefined8 local_260;
  int local_258;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  long local_220 [8];
  long *local_1e0;
  undefined1 local_1d8 [64];
  undefined1 *local_198;
  int local_18c [7];
  int *local_170;
  MFIter local_168;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_108;
  byte local_f9;
  undefined4 local_f4;
  undefined8 local_e0;
  int local_d8;
  int *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  undefined8 local_b8;
  int local_b0;
  int *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  undefined4 local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined1 *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_f9 = in_R8B & 1;
  local_108._M_head_impl = (FabArrayBase *)0x0;
  local_f4 = in_EDX;
  MFIter::MFIter(in_RDI,in_stack_fffffffffffffd68,SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0))
  ;
  while (bVar6 = MFIter::isValid(&local_168), bVar6) {
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffdac);
    local_170 = local_18c;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    plVar7 = local_220;
    local_198 = local_1d8;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    local_d0 = local_170;
    local_8 = local_170;
    local_c = 0;
    iVar1 = *local_170;
    local_18 = local_170;
    local_1c = 1;
    iVar2 = local_170[1];
    local_e0 = *(undefined8 *)local_170;
    local_28 = local_170;
    local_2c = 2;
    local_264 = local_170[2];
    local_a8 = local_170;
    local_38 = local_170 + 3;
    local_3c = 0;
    in_stack_fffffffffffffdb4 = *local_38;
    local_48 = local_170 + 3;
    local_4c = 1;
    iVar3 = local_170[4];
    local_260 = *(undefined8 *)local_38;
    local_58 = local_170 + 3;
    local_5c = 2;
    iVar4 = local_170[5];
    local_258 = iVar4;
    local_1e0 = plVar7;
    local_d8 = local_264;
    local_c4 = iVar1;
    iStack_c0 = iVar2;
    local_bc = local_264;
    local_b8 = local_260;
    local_b0 = iVar4;
    local_9c = in_stack_fffffffffffffdb4;
    iStack_98 = iVar3;
    local_94 = iVar4;
    for (; iVar5 = iVar2, local_264 <= iVar4; local_264 = local_264 + 1) {
      while (local_268 = iVar5, iVar5 = iVar1, local_268 <= iVar3) {
        while (local_26c = iVar5, local_26c <= in_stack_fffffffffffffdb4) {
          local_68 = local_1e0;
          local_6c = local_26c;
          local_70 = local_268;
          local_74 = local_264;
          if (*(int *)(*local_1e0 +
                      ((long)(local_26c - (int)local_1e0[4]) +
                       (long)(local_268 - *(int *)((long)local_1e0 + 0x24)) * local_1e0[1] +
                      (long)(local_264 - (int)local_1e0[5]) * local_1e0[2]) * 4) != 0) {
            local_80 = local_198;
            local_84 = local_26c;
            local_88 = local_268;
            local_8c = local_264;
            local_90 = local_f4;
            std::abs((int)*(undefined8 *)(local_198 + 0x10));
            in_stack_fffffffffffffd48 = extraout_XMM0_Qa;
            in_stack_fffffffffffffd40 = (MFIter *)std::max<double>((double *)&local_108,&local_278);
            local_108._M_head_impl =
                 (in_stack_fffffffffffffd40->m_fa)._M_t.
                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          }
          iVar5 = local_26c + 1;
        }
        iVar5 = local_268 + 1;
      }
    }
    MFIter::operator++(&local_168);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd40);
  if ((local_f9 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>((double *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
  }
  return (Real)local_108._M_head_impl;
}

Assistant:

Real
MultiFab::norm0 (const iMultiFab& mask, int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::norm0(mask)");

    Real nm0 = Real(0.0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& maskma = mask.const_arrays();
        nm0 = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            if (maskma[box_no](i,j,k)) {
                return amrex::Math::abs(ma[box_no](i,j,k,comp));
            } else {
                return Real(0.0);
            }
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:nm0)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.growntilebox(nghost);
            auto const& a = this->const_array(mfi);
            auto const& mskfab = mask.const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                if (mskfab(i,j,k)) {
                    nm0 = std::max(nm0, amrex::Math::abs(a(i,j,k,comp)));
                }
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Max(nm0, ParallelContext::CommunicatorSub());
    }

    return nm0;
}